

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

size_t get_filesize(string *filename)

{
  size_t sVar1;
  runtime_error *this;
  ifstream ifs;
  byte abStack_1f8 [488];
  
  std::ifstream::ifstream(&ifs,(string *)filename,_S_bin|_S_ate);
  if ((abStack_1f8[*(long *)(_ifs + -0x18)] & 5) == 0) {
    sVar1 = std::istream::tellg();
    std::ifstream::~ifstream(&ifs);
    return sVar1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Failed open file ");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::size_t get_filesize(const std::string &filename)
{
    std::ifstream ifs(filename, std::ifstream::ate | std::ifstream::binary);
    if (!ifs)
        throw std::runtime_error("Failed open file ");

    return static_cast<std::size_t>(ifs.tellg());
}